

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

double __thiscall smf::MidiFile::linearTickInterpolationAtSecond(MidiFile *this,double seconds)

{
  double dVar1;
  pointer p_Var2;
  pointer p_Var3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  long lVar7;
  double *pdVar8;
  
  if (((this->m_timemapvalid != false) || (buildTimeMap(this), this->m_timemapvalid != false)) &&
     (0.0 <= seconds)) {
    p_Var2 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    dVar1 = p_Var2[-1].seconds;
    if (seconds <= dVar1) {
      p_Var3 = (this->m_timemap).super__Vector_base<smf::_TickTime,_std::allocator<smf::_TickTime>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar5 = (long)p_Var2 - (long)p_Var3 >> 4;
      uVar4 = (uint)uVar5;
      if (dVar1 * 0.5 <= seconds) {
        pdVar8 = &p_Var3[uVar4 - 1].seconds;
        uVar5 = uVar5 & 0xffffffff;
        do {
          uVar6 = (uint)uVar5;
          if ((int)uVar6 < 2) {
            return -1.0;
          }
          dVar1 = *pdVar8;
          if (dVar1 < seconds) break;
          uVar6 = uVar6 - 1;
          uVar5 = (ulong)uVar6;
          pdVar8 = pdVar8 + -2;
        } while ((dVar1 != seconds) || (NAN(dVar1) || NAN(seconds)));
LAB_0011e570:
        if ((int)uVar6 < (int)(uVar4 - 1)) {
          return (((double)p_Var3[(long)(int)uVar6 + 1].tick - (double)p_Var3[uVar6].tick) /
                 (p_Var3[(long)(int)uVar6 + 1].seconds - p_Var3[uVar6].seconds)) *
                 (seconds - p_Var3[uVar6].seconds) + (double)p_Var3[uVar6].tick;
        }
      }
      else if (0 < (int)uVar4) {
        pdVar8 = &p_Var3->seconds;
        lVar7 = 0;
        do {
          dVar1 = *pdVar8;
          if (seconds < dVar1) {
            if (lVar7 == 0) {
              return -1.0;
            }
            uVar6 = ~(uint)lVar7;
            goto LAB_0011e570;
          }
          if ((dVar1 == seconds) && (!NAN(dVar1) && !NAN(seconds))) {
            uVar6 = -(uint)lVar7;
            goto LAB_0011e570;
          }
          lVar7 = lVar7 + -1;
          pdVar8 = pdVar8 + 2;
        } while (-lVar7 != (ulong)(uVar4 & 0x7fffffff));
      }
    }
  }
  return -1.0;
}

Assistant:

double MidiFile::linearTickInterpolationAtSecond(double seconds) {
	if (m_timemapvalid == 0) {
		buildTimeMap();
		if (m_timemapvalid == 0) {
			return -1.0;    // something went wrong
		}
	}

	int i;
	double lasttime = m_timemap[m_timemap.size()-1].seconds;
	// give an error value of -1 if time is out of range of data.
	if (seconds < 0.0) {
		return -1.0;
	}
	if (seconds > m_timemap[m_timemap.size()-1].seconds) {
		return -1.0;
	}

	// Guess which side of the list is closest to target:
	// Could do a more efficient algorithm since time values are sorted,
	// but good enough for now...
	int startindex = -1;
	if (seconds < lasttime / 2) {
		for (i=0; i<(int)m_timemap.size(); i++) {
			if (m_timemap[i].seconds > seconds) {
				startindex = i-1;
				break;
			} else if (m_timemap[i].seconds == seconds) {
				startindex = i;
				break;
			}
		}
	} else {
		for (i=(int)m_timemap.size()-1; i>0; i--) {
			if (m_timemap[i].seconds < seconds) {
				startindex = i+1;
				break;
			} else if (m_timemap[i].seconds == seconds) {
				startindex = i;
				break;
			}
		}
	}

	if (startindex < 0) {
		return -1.0;
	}
	if (startindex >= (int)m_timemap.size()-1) {
		return -1.0;
	}

	double x1 = m_timemap[startindex].seconds;
	double x2 = m_timemap[startindex+1].seconds;
	double y1 = m_timemap[startindex].tick;
	double y2 = m_timemap[startindex+1].tick;
	double xi = seconds;

	return (xi-x1) * ((y2-y1)/(x2-x1)) + y1;
}